

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O0

unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
__thiscall
duckdb::BindContext::PositionToColumn(BindContext *this,PositionalReferenceExpression *ref)

{
  ulong uVar1;
  string *msg;
  BindContext *in_RDX;
  unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_> in_RDI;
  string error;
  string column_name;
  string table_name;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> this_00;
  string local_78 [32];
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_38 [8];
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  PositionalReferenceExpression *in_stack_ffffffffffffffe0;
  
  this_00._M_head_impl =
       (ColumnRefExpression *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>
       .super__Head_base<0UL,_duckdb::ColumnRefExpression_*,_false>._M_head_impl;
  ::std::__cxx11::string::string(local_38);
  ::std::__cxx11::string::string(local_58);
  BindColumn(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    msg = (string *)__cxa_allocate_exception(0x10);
    BinderException::BinderException((BinderException *)this_00._M_head_impl,msg);
    __cxa_throw(msg,&BinderException::typeinfo,BinderException::~BinderException);
  }
  make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&,std::__cxx11::string&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  ::std::__cxx11::string::~string(local_78);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_38);
  return (unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
         )(__uniq_ptr_impl<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
           )in_RDI._M_t.
            super___uniq_ptr_impl<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>
            .super__Head_base<0UL,_duckdb::ColumnRefExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ColumnRefExpression> BindContext::PositionToColumn(PositionalReferenceExpression &ref) {
	string table_name, column_name;

	string error = BindColumn(ref, table_name, column_name);
	if (!error.empty()) {
		throw BinderException(error);
	}
	return make_uniq<ColumnRefExpression>(column_name, table_name);
}